

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::Clear(X3DImporter *this)

{
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_00;
  iterator it;
  _List_node_base *p_Var1;
  
  this->NodeElement_Cur = (CX3DImporter_NodeElement *)0x0;
  p_Var1 = (this->NodeElement_List).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  this_00 = &this->NodeElement_List;
  if (p_Var1 != (_List_node_base *)this_00) {
    do {
      if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 8))();
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)this_00);
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    clear(this_00);
    return;
  }
  return;
}

Assistant:

void X3DImporter::Clear() {
	NodeElement_Cur = nullptr;
	// Delete all elements
	if(!NodeElement_List.empty()) {
        for ( std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it ) {
            delete *it;
        }
		NodeElement_List.clear();
	}
}